

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

bool google::protobuf::internal::EpsCopyInputStream::ParseEndsInSlopRegion
               (char *begin,int overrun,int depth)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  LogMessage *pLVar4;
  undefined1 auVar5 [16];
  int32_t size;
  uint64_t val;
  char *pcStack_a8;
  uint32_t tag;
  char *end;
  char *ptr;
  undefined8 local_90;
  LogMessageFatal local_88 [23];
  Voidify local_71;
  string *local_70;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_58 [16];
  LogMessageFatal local_48 [23];
  Voidify local_31;
  string *local_30;
  string *absl_log_internal_check_op_result;
  int local_20;
  int kSlopBytes;
  int depth_local;
  int overrun_local;
  char *begin_local;
  
  absl_log_internal_check_op_result._4_4_ = 0x10;
  local_20 = depth;
  kSlopBytes = overrun;
  _depth_local = begin;
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(overrun);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_30 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"overrun >= 0");
  if (local_30 != (string *)0x0) {
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.cc"
               ,0x20,local_58._0_8_,local_58._8_8_);
    pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(kSlopBytes);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0x10);
  local_70 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,iVar2,"overrun <= kSlopBytes");
  if (local_70 == (string *)0x0) {
    end = _depth_local + kSlopBytes;
    pcStack_a8 = _depth_local + 0x10;
    local_70 = (string *)0x0;
    while( true ) {
      if (pcStack_a8 <= end) {
        return false;
      }
      end = ReadTag(end,(uint32_t *)((long)&val + 4),0);
      if ((end == (char *)0x0) || (pcStack_a8 < end)) break;
      if (val._4_4_ == 0) {
        return true;
      }
      switch(val._4_4_ & 7) {
      case 0:
        end = VarintParse<unsigned_long>(end,(unsigned_long *)&stack0xffffffffffffff48);
        if (end == (char *)0x0) {
          return false;
        }
        break;
      case 1:
        end = end + 8;
        break;
      case 2:
        uVar3 = ReadSize(&end);
        if ((end == (char *)0x0) || ((long)pcStack_a8 - (long)end < (long)(int)uVar3)) {
          return false;
        }
        end = end + (int)uVar3;
        break;
      case 3:
        local_20 = local_20 + 1;
        break;
      case 4:
        local_20 = local_20 + -1;
        if (local_20 < 0) {
          return true;
        }
        break;
      case 5:
        end = end + 4;
        break;
      default:
        return false;
      }
    }
    return false;
  }
  auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
  local_90 = auVar5._8_8_;
  ptr = auVar5._0_8_;
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.cc"
             ,0x21,ptr,local_90);
  pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_88);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_71,pLVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_88);
}

Assistant:

bool EpsCopyInputStream::ParseEndsInSlopRegion(const char* begin, int overrun,
                                               int depth) {
  constexpr int kSlopBytes = EpsCopyInputStream::kSlopBytes;
  ABSL_DCHECK_GE(overrun, 0);
  ABSL_DCHECK_LE(overrun, kSlopBytes);
  auto ptr = begin + overrun;
  auto end = begin + kSlopBytes;
  while (ptr < end) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ptr == nullptr || ptr > end) return false;
    // ending on 0 tag is allowed and is the major reason for the necessity of
    // this function.
    if (tag == 0) return true;
    switch (tag & 7) {
      case 0: {  // Varint
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        if (ptr == nullptr) return false;
        break;
      }
      case 1: {  // fixed64
        ptr += 8;
        break;
      }
      case 2: {  // len delim
        int32_t size = ReadSize(&ptr);
        if (ptr == nullptr || size > end - ptr) return false;
        ptr += size;
        break;
      }
      case 3: {  // start group
        depth++;
        break;
      }
      case 4: {                    // end group
        if (--depth < 0) return true;  // We exit early
        break;
      }
      case 5: {  // fixed32
        ptr += 4;
        break;
      }
      default:
        return false;  // Unknown wireformat
    }
  }
  return false;
}